

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_vtable.hpp
# Opt level: O0

printable_vtable * __thiscall
printable_vtable::operator=(printable_vtable *this,printable_vtable *rhs)

{
  undefined1 local_40 [8];
  printable_vtable temp;
  printable_vtable *rhs_local;
  printable_vtable *this_local;
  
  temp.value_ = rhs;
  printable_vtable((printable_vtable *)local_40,rhs);
  std::swap<void(*)(),3ul>((array<void_(*)(),_3UL> *)local_40,&this->vtable_);
  std::swap<void*(*)(printable_vtable_const*)>
            ((_func_void_ptr_printable_vtable_ptr **)(temp.vtable_._M_elems + 2),
             &this->get_value_ptr_);
  std::swap<void*>(&temp.get_value_ptr_,&this->value_);
  ~printable_vtable((printable_vtable *)local_40);
  return this;
}

Assistant:

printable_vtable & operator= (printable_vtable && rhs) noexcept
    {
        printable_vtable temp(std::move(rhs));
        std::swap(temp.vtable_, vtable_);
        std::swap(temp.get_value_ptr_, get_value_ptr_);
        std::swap(temp.value_, value_);
        return *this;
    }